

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Entry * kj::_::
        CopyConstructArray_<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry,_kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry_*,_true,_false>
        ::apply(Entry *pos,Entry *start,Entry *end)

{
  Entry *location;
  Entry *params;
  undefined1 local_30 [8];
  ExceptionGuard guard;
  Entry *end_local;
  Entry *start_local;
  Entry *pos_local;
  
  guard.pos = end;
  ExceptionGuard::ExceptionGuard((ExceptionGuard *)local_30,pos);
  end_local = start;
  while (location = guard.start, end_local != guard.pos) {
    params = mv<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry>(end_local);
    ctor<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry,kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry>
              (location,params);
    guard.start = guard.start + 1;
    end_local = end_local + 1;
  }
  local_30 = (undefined1  [8])guard.start;
  ExceptionGuard::~ExceptionGuard((ExceptionGuard *)local_30);
  return location;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }